

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O3

string * __thiscall
gl3cts::TextureSwizzle::SmokeTest::prepareCoordinates_abi_cxx11_
          (string *__return_storage_ptr__,SmokeTest *this,testCase *test_case)

{
  TestError *this_00;
  ulong uVar1;
  undefined *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  size_t position;
  size_t local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  sVar6 = test_case->m_texture_access_index;
  lVar5 = test_case->m_source_texture_target_index * 0x30;
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"TYPE(VAL_LIST)","");
  lVar3 = *(long *)(texture_access + sVar6 * 0x18 + 8);
  lVar4 = *(long *)(texture_targets + lVar5);
  lVar5 = *(long *)(texture_targets + lVar5 + 8);
  uVar1 = (lVar5 + lVar4 + lVar3) - 1;
  if (texture_access[sVar6 * 0x18 + 0x11] == '\0') {
    if (3 < uVar1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid value",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                 ,0xc9d);
      goto LAB_0084e213;
    }
    puVar2 = &DAT_020c10e8;
  }
  else {
    if (3 < uVar1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid value",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                 ,0xcb2);
LAB_0084e213:
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    puVar2 = &DAT_020c1108;
  }
  local_40 = 0;
  Utils::replaceToken("TYPE",&local_40,*(GLchar **)(puVar2 + (lVar4 + lVar3 + lVar5) * 8 + -8),
                      __return_storage_ptr__);
  for (; lVar5 != 0; lVar5 = lVar5 + -1) {
    sVar6 = local_40 + 1;
    Utils::replaceToken("VAL_LIST",&local_40,"0, VAL_LIST",__return_storage_ptr__);
    local_40 = sVar6;
  }
  for (; lVar4 != 0; lVar4 = lVar4 + -1) {
    sVar6 = local_40 + 1;
    Utils::replaceToken("VAL_LIST",&local_40,"0, VAL_LIST",__return_storage_ptr__);
    local_40 = sVar6;
  }
  if (lVar3 != 0) {
    do {
      sVar6 = local_40 + 1;
      Utils::replaceToken("VAL_LIST",&local_40,"1, VAL_LIST",__return_storage_ptr__);
      lVar3 = lVar3 + -1;
      local_40 = sVar6;
    } while (lVar3 != 0);
  }
  Utils::replaceToken(", VAL_LIST",&local_40,"",__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string SmokeTest::prepareCoordinates(const testCase& test_case)
{
	const _texture_access& access = texture_access[test_case.m_texture_access_index];
	const _texture_target& target = texture_targets[test_case.m_source_texture_target_index];

	const glw::GLchar* type = 0;

	std::string coordinates = "TYPE(VAL_LIST)";

	if (false == access.m_use_integral_coordinates)
	{
		switch (access.m_n_coordinates + target.m_n_array_coordinates + target.m_n_coordinates)
		{
		case 1:
			type = "float";
			break;
		case 2:
			type = "vec2";
			break;
		case 3:
			type = "vec3";
			break;
		case 4:
			type = "vec4";
			break;
		default:
			TCU_FAIL("Invalid value");
			break;
		}
	}
	else
	{
		switch (access.m_n_coordinates + target.m_n_array_coordinates + target.m_n_coordinates)
		{
		case 1:
			type = "int";
			break;
		case 2:
			type = "ivec2";
			break;
		case 3:
			type = "ivec3";
			break;
		case 4:
			type = "ivec4";
			break;
		default:
			TCU_FAIL("Invalid value");
			break;
		}
	}

	size_t position = 0;

	Utils::replaceToken("TYPE", position, type, coordinates);

	for (size_t i = 0; i < target.m_n_coordinates; ++i)
	{
		size_t start_position = position;

		Utils::replaceToken("VAL_LIST", position, "0, VAL_LIST", coordinates);

		position = start_position + 1;
	}

	for (size_t i = 0; i < target.m_n_array_coordinates; ++i)
	{
		size_t start_position = position;

		Utils::replaceToken("VAL_LIST", position, "0, VAL_LIST", coordinates);

		position = start_position + 1;
	}

	for (size_t i = 0; i < access.m_n_coordinates; ++i)
	{
		size_t start_position = position;

		Utils::replaceToken("VAL_LIST", position, "1, VAL_LIST", coordinates);

		position = start_position + 1;
	}

	Utils::replaceToken(", VAL_LIST", position, "", coordinates);

	return coordinates;
}